

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O2

int Fraig_MarkTfi2_rec(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = 0;
  iVar4 = 0;
  do {
    iVar2 = pNode->TravId;
    iVar1 = pMan->nTravIds;
    if (iVar2 == iVar1) {
LAB_00526ae1:
      return iVar3 + iVar4;
    }
    pNode->TravId = iVar1;
    if ((iVar2 == iVar1 + -1) || (-1 < pNode->NumPi)) {
      iVar3 = 1;
      goto LAB_00526ae1;
    }
    iVar2 = Fraig_MarkTfi2_rec(pMan,(Fraig_Node_t *)((ulong)pNode->p1 & 0xfffffffffffffffe));
    pNode = (Fraig_Node_t *)((ulong)pNode->p2 & 0xfffffffffffffffe);
    iVar4 = iVar4 + iVar2;
  } while( true );
}

Assistant:

int Fraig_MarkTfi2_rec( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    // skip the visited node
    if ( pNode->TravId == pMan->nTravIds )
        return 0;
    // skip the boundary node
    if ( pNode->TravId == pMan->nTravIds-1 )
    {
        pNode->TravId = pMan->nTravIds;
        return 1;
    }
    pNode->TravId = pMan->nTravIds;
    // skip the PI node
    if ( pNode->NumPi >= 0 )
        return 1;
    // check the children
    return Fraig_MarkTfi2_rec( pMan, Fraig_Regular(pNode->p1) ) +
           Fraig_MarkTfi2_rec( pMan, Fraig_Regular(pNode->p2) );
}